

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StopFreezePdu.cpp
# Opt level: O2

void __thiscall DIS::StopFreezePdu::unmarshal(StopFreezePdu *this,DataStream *dataStream)

{
  SimulationManagementFamilyPdu::unmarshal(&this->super_SimulationManagementFamilyPdu,dataStream);
  ClockTime::unmarshal(&this->_realWorldTime,dataStream);
  DataStream::operator>>(dataStream,&this->_reason);
  DataStream::operator>>(dataStream,&this->_frozenBehavior);
  DataStream::operator>>(dataStream,&this->_padding1);
  DataStream::operator>>(dataStream,&this->_requestID);
  return;
}

Assistant:

void StopFreezePdu::unmarshal(DataStream& dataStream)
{
    SimulationManagementFamilyPdu::unmarshal(dataStream); // unmarshal information in superclass first
    _realWorldTime.unmarshal(dataStream);
    dataStream >> _reason;
    dataStream >> _frozenBehavior;
    dataStream >> _padding1;
    dataStream >> _requestID;
}